

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-writer.c
# Opt level: O0

void labpack_write_double(labpack_writer_t *writer,double value)

{
  _Bool _Var1;
  double value_local;
  labpack_writer_t *writer_local;
  
  if (writer == (labpack_writer_t *)0x0) {
    __assert_fail("writer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-writer.c"
                  ,0x12f,"void labpack_write_double(labpack_writer_t *, double)");
  }
  _Var1 = labpack_writer_is_ok(writer);
  if (_Var1) {
    mpack_write_double(writer->encoder,value);
    labpack_writer_check_encoder(writer);
  }
  return;
}

Assistant:

void
labpack_write_double(labpack_writer_t* writer, double value)
{
    assert(writer);
    if (labpack_writer_is_ok(writer)) {
        mpack_write_double(writer->encoder, value);
        labpack_writer_check_encoder(writer);
    }
}